

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O3

bool __thiscall trimesh::dataset_t::compare_cells<0>(dataset_t *this,cellid_t *c1,cellid_t *c2)

{
  double dVar1;
  double dVar2;
  tri_cc_t *ptVar3;
  pointer pdVar4;
  bool bVar5;
  uint uVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  ptVar3 = (this->m_tcc).px;
  if (ptVar3 != (tri_cc_t *)0x0) {
    uVar6 = tri_cc_t::get_cell_dim(ptVar3,*c1);
    if (uVar6 != 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,"Failed to assert condition ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,"m_tcc->get_cell_dim(c1) == 0",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"at (",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"compare_cells",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,",",1);
      poVar7 = (ostream *)std::ostream::operator<<(local_198,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") \n ",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,asStack_1c8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ptVar3 = (this->m_tcc).px;
    if (ptVar3 != (tri_cc_t *)0x0) {
      uVar6 = tri_cc_t::get_cell_dim(ptVar3,*c2);
      if (uVar6 == 0) {
        pdVar4 = (this->m_vert_fns->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar1 = pdVar4[*c1];
        dVar2 = pdVar4[*c2];
        bVar5 = *c1 < *c2;
        if (dVar1 != dVar2) {
          bVar5 = dVar1 < dVar2;
        }
        if (NAN(dVar1) || NAN(dVar2)) {
          bVar5 = dVar1 < dVar2;
        }
        return bVar5;
      }
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,"Failed to assert condition ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,"m_tcc->get_cell_dim(c2) == 0",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"at (",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"compare_cells",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,",",1);
      poVar7 = (ostream *)std::ostream::operator<<(local_198,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") \n ",4);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,asStack_1c8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<tri_cc_t>::operator->() const [T = tri_cc_t]"
               );
}

Assistant:

inline bool dataset_t::compare_cells<0>(const cellid_t & c1, const cellid_t &c2) const
  {
    ASSERT(m_tcc->get_cell_dim(c1) == 0);
    ASSERT(m_tcc->get_cell_dim(c2) == 0);

    fn_t f1 = m_vert_fns[c1];
    fn_t f2 = m_vert_fns[c2];

    if (f1 != f2)
      return f1 < f2;

    return c1 < c2;
  }